

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void wasm::copy_file(string *input,string *output)

{
  undefined1 local_440 [8];
  ifstream src;
  streambuf local_430 [504];
  undefined1 local_238 [8];
  ofstream dst;
  PathString local_38;
  
  Path::to_path((PathString *)local_238,input);
  std::ifstream::ifstream(local_440,(string *)local_238,_S_bin);
  std::__cxx11::string::~string((string *)local_238);
  Path::to_path(&local_38,output);
  std::ofstream::ofstream(local_238,(string *)&local_38,_S_bin);
  std::__cxx11::string::~string((string *)&local_38);
  std::ostream::operator<<(local_238,local_430);
  std::ofstream::~ofstream(local_238);
  std::ifstream::~ifstream(local_440);
  return;
}

Assistant:

void wasm::copy_file(std::string input, std::string output) {
  std::ifstream src(wasm::Path::to_path(input), std::ios::binary);
  std::ofstream dst(wasm::Path::to_path(output), std::ios::binary);
  dst << src.rdbuf();
}